

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

void __thiscall wabt::Var::set_index(Var *this,Index index)

{
  Destroy(this);
  this->type_ = Index;
  (this->field_2).index_ = index;
  return;
}

Assistant:

void Var::set_index(Index index) {
  Destroy();
  type_ = VarType::Index;
  index_ = index;
}